

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbols.hpp
# Opt level: O3

char32_t * __thiscall
cs::mapping<char32_t,_char32_t>::match(mapping<char32_t,_char32_t> *this,char32_t *k)

{
  size_type sVar1;
  mapped_type *pmVar2;
  compile_error *this_00;
  string local_38;
  
  sVar1 = std::
          map<char32_t,_char32_t,_std::less<char32_t>,_std::allocator<std::pair<const_char32_t,_char32_t>_>_>
          ::count(&this->mDat,k);
  if (sVar1 != 0) {
    pmVar2 = std::
             map<char32_t,_char32_t,_std::less<char32_t>,_std::allocator<std::pair<const_char32_t,_char32_t>_>_>
             ::at(&this->mDat,k);
    return pmVar2;
  }
  this_00 = (compile_error *)__cxa_allocate_exception(0x28);
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"Undefined Mapping.","");
  compile_error::compile_error(this_00,&local_38);
  __cxa_throw(this_00,&compile_error::typeinfo,compile_error::~compile_error);
}

Assistant:

const T &match(const Key &k) const
		{
			if (!exist(k))
				throw compile_error("Undefined Mapping.");
			return mDat.at(k);
		}